

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O2

void __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
::ConvertToRealMap(small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
                   *this)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  char acStack_c0 [8];
  ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> temp_array [4];
  
  for (lVar6 = 8; lVar6 != 0xa8; lVar6 = lVar6 + 0x28) {
    *(undefined8 *)(temp_array[0].space_ + lVar6 + 0x18) =
         *(undefined8 *)((long)&this->field_2 + lVar6 + 0x18);
    puVar2 = (undefined8 *)((long)&this->size_ + lVar6);
    uVar3 = *puVar2;
    uVar4 = puVar2[1];
    puVar2 = (undefined8 *)((long)&this->field_2 + lVar6 + 8);
    uVar5 = puVar2[1];
    *(undefined8 *)(temp_array[0].space_ + lVar6 + 8) = *puVar2;
    *(undefined8 *)(temp_array[0].space_ + lVar6 + 0x10) = uVar5;
    *(undefined8 *)(temp_array[0].space_ + lVar6 + -8) = uVar3;
    *(undefined8 *)(temp_array[0].space_ + lVar6) = uVar4;
  }
  this->size_ = -1;
  *(undefined4 *)((long)&this->field_2 + 8) = 0;
  *(undefined8 *)((long)&this->field_2 + 0x10) = 0;
  puVar1 = (undefined1 *)((long)&this->field_2 + 8);
  *(undefined1 **)((long)&this->field_2 + 0x18) = puVar1;
  *(undefined1 **)((long)&this->field_2 + 0x20) = puVar1;
  *(undefined8 *)((long)&this->field_2 + 0x28) = 0;
  for (lVar6 = 0; lVar6 != 0xa0; lVar6 = lVar6 + 0x28) {
    acStack_c0[0] = '[';
    acStack_c0[1] = -0x31;
    acStack_c0[2] = '\x12';
    acStack_c0[3] = '\0';
    acStack_c0[4] = '\0';
    acStack_c0[5] = '\0';
    acStack_c0[6] = '\0';
    acStack_c0[7] = '\0';
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,ctemplate::TemplateString>,std::_Select1st<std::pair<unsigned_long_const,ctemplate::TemplateString>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>
    ::_M_emplace_unique<std::pair<unsigned_long_const,ctemplate::TemplateString>&>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,ctemplate::TemplateString>,std::_Select1st<std::pair<unsigned_long_const,ctemplate::TemplateString>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>
                *)&(this->field_2).dummy_,
               (pair<const_unsigned_long,_ctemplate::TemplateString> *)
               (temp_array[0].space_ + lVar6));
  }
  return;
}

Assistant:

void ConvertToRealMap() {
    // Move the current elements into a temporary array.
    ManualConstructor<value_type> temp_array[kArraySize];

    for (int i = 0; i < kArraySize; i++) {
      temp_array[i].Init(*array_[i]);
      array_[i].Destroy();
    }

    // Initialize the map.
    size_ = -1;
    functor_(&map_);

    // Insert elements into it.
    for (int i = 0; i < kArraySize; i++) {
      map_->insert(*temp_array[i]);
      temp_array[i].Destroy();
    }
  }